

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall ArchiveSpanFallback_Write_Test::TestBody(ArchiveSpanFallback_Write_Test *this)

{
  mock_fallback_policy *this_00;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *pTVar1;
  TypedExpectation<void_(int_&)> *this_01;
  reference args;
  type tVar2;
  iterator __begin0;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> local_110;
  array<int,_3UL> arr;
  iterator __end0;
  archive_type archive;
  
  anon_unknown.dwarf_62afb::ArchiveSpanFallback::archive_type::archive_type(&archive);
  this_00 = &archive.
             super_writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>.
             policy_;
  __end0.index_ =
       (ptrdiff_t)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  __end0.span_ = (span<int,__1L> *)&PTR__MatcherBase_00187b40;
  anon_unknown.dwarf_62afb::ArchiveSpanFallback::mock_fallback_policy::gmock_put
            (&local_110,this_00,(Matcher<const_int_&> *)&__end0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
           InternalExpectedAt(&local_110,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                              ,0xf4,"archive.writer_policy ()","put (_)");
  pTVar1 = testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>
           ::Times(pTVar1,3);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::ReturnAction
            ((ReturnAction<pstore::serialize::archive::void_type> *)&arr);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<pstore::serialize::archive::void_type_(const_int_&)> *)&__begin0,
             (ReturnAction *)&arr);
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::
  WillRepeatedly(pTVar1,(Action<pstore::serialize::archive::void_type_(const_int_&)> *)&__begin0);
  std::_Function_base::~_Function_base((_Function_base *)&__begin0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(arr._M_elems + 2));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)&local_110.matchers_);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&__end0);
  __begin0.index_ =
       (ptrdiff_t)
       testing::internal::MatcherBase<int&>::
       GetVTable<testing::internal::MatcherBase<int&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  __begin0.span_ = (span<int,__1L> *)&PTR__MatcherBase_00187ca0;
  anon_unknown.dwarf_62afb::ArchiveSpanFallback::archive_type::gmock_get
            ((MockSpec<void_(int_&)> *)&local_110,&archive,(Matcher<int_&> *)&__begin0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      ((MockSpec<void_(int_&)> *)&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0xf5,"archive","get (_)");
  testing::internal::TypedExpectation<void_(int_&)>::Times(this_01,0);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)&local_110.matchers_);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)&__begin0);
  if (archive.super_writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>.
      flushed_ != true) {
    local_110.function_mocker_ =
         (FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *)0x3;
    local_110.matchers_.super__Tuple_impl<0UL,_testing::Matcher<const_int_&>_>.
    super__Head_base<0UL,_testing::Matcher<const_int_&>,_false>._M_head_impl.
    super_MatcherBase<const_int_&>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&arr;
    pstore::gsl::span<int,_-1L>::begin((span<int,__1L> *)&__begin0);
    pstore::gsl::span<int,_-1L>::end((span<int,__1L> *)&__end0);
    while ((__begin0.span_ != __end0.span_ || (__begin0.index_ != __end0.index_))) {
      args = pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator*
                       (&__begin0);
      testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
                ((UntypedFunctionMockerBase *)this_00,this_00,"put");
      testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::Invoke
                (&this_00->gmock01_put_228,args);
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator++(&__begin0)
      ;
    }
    local_110.function_mocker_ =
         (FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *)0xc;
    tVar2 = pstore::serialize::archive::unsigned_cast<long>((long *)&local_110);
    archive.super_writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>.
    bytes_consumed_ =
         archive.super_writer_base<(anonymous_namespace)::ArchiveSpanFallback::mock_fallback_policy>
         .bytes_consumed_ + tVar2;
    anon_unknown.dwarf_62afb::ArchiveSpanFallback::archive_type::~archive_type(&archive);
    return;
  }
  pstore::assert_failed
            ("!flushed_",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
             ,0xb5);
}

Assistant:

TEST_F (ArchiveSpanFallback, Write) {
    using ::testing::_;
    using ::testing::Return;

    archive_type archive;
    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (archive.writer_policy (), put (_)).Times (3).WillRepeatedly (Return (ret));
    EXPECT_CALL (archive, get (_)).Times (0);

    std::array<int, 3> arr;
    pstore::serialize::write (archive, ::pstore::gsl::span<int> (arr));
}